

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void str_hex(char *dst,int dst_size,void *data,int data_size)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  
  uVar1 = dst_size / 4 - 4;
  if (data_size < (int)uVar1) {
    uVar1 = data_size;
  }
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  pcVar4 = dst + 3;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pcVar4[-3] = "0123456789ABCDEF"[*(byte *)((long)data + uVar3) >> 4];
    pcVar4[-2] = "0123456789ABCDEF"[*(byte *)((long)data + uVar3) & 0xf];
    pcVar4[-1] = ' ';
    pcVar4[0] = '\0';
    pcVar4 = pcVar4 + 3;
  }
  return;
}

Assistant:

void str_hex(char *dst, int dst_size, const void *data, int data_size)
{
	static const char hex[] = "0123456789ABCDEF";
	int b;

	for(b = 0; b < data_size && b < dst_size/4-4; b++)
	{
		dst[b*3] = hex[((const unsigned char *)data)[b]>>4];
		dst[b*3+1] = hex[((const unsigned char *)data)[b]&0xf];
		dst[b*3+2] = ' ';
		dst[b*3+3] = 0;
	}
}